

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalWriteFile
                    (CPalThread *pThread,HANDLE hFile,LPCVOID lpBuffer,DWORD nNumberOfBytesToWrite,
                    LPDWORD lpNumberOfBytesWritten,LPOVERLAPPED lpOverlapped)

{
  int iUnixFd;
  PAL_ERROR PVar1;
  ssize_t sVar2;
  char *__format;
  undefined8 *local_58;
  IFileTransactionLock *pTransactionLock;
  IPalObject *pFileObject;
  CFileProcessLocalData *pLocalData;
  IDataLock *pLocalDataLock;
  LONG writeOffsetStartLow;
  LONG writeOffsetStartHigh;
  
  pTransactionLock = (IFileTransactionLock *)0x0;
  pFileObject = (IPalObject *)0x0;
  pLocalData = (CFileProcessLocalData *)0x0;
  local_58 = (undefined8 *)0x0;
  pLocalDataLock._0_4_ = 0;
  pLocalDataLock._4_4_ = 0;
  if (lpNumberOfBytesWritten == (LPDWORD)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalWriteFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x806);
    __format = "lpNumberOfBytesWritten is NULL\n";
  }
  else {
    *lpNumberOfBytesWritten = 0;
    PVar1 = 6;
    if ((hFile == (HANDLE)0xffffffffffffffff) || (pStdIn == hFile)) goto LAB_00123bc0;
    if (lpOverlapped == (LPOVERLAPPED)0x0) {
      PVar1 = (**(code **)(*g_pObjectManager + 0x28))
                        (g_pObjectManager,pThread,hFile,aotFile,0x40000000,&pTransactionLock);
      if ((PVar1 != 0) ||
         (PVar1 = (*pTransactionLock->_vptr_IFileTransactionLock[3])
                            (pTransactionLock,pThread,0,&pLocalData,&pFileObject), PVar1 != 0))
      goto LAB_00123bc0;
      if (*(int *)((long)&pFileObject[2]._vptr_IPalObject + 4) == 1) {
        if (PAL_InitializeChakraCoreCalled != false) {
          PVar1 = 5;
          goto LAB_00123bc0;
        }
LAB_00123d76:
        abort();
      }
      iUnixFd = *(int *)&pFileObject[1]._vptr_IPalObject;
      if (pFileObject->_vptr_IPalObject != (_func_int **)0x0) {
        PVar1 = InternalSetFilePointerForUnixFd
                          (iUnixFd,0,(PLONG)((long)&pLocalDataLock + 4),1,(PLONG)&pLocalDataLock);
        if (PVar1 != 0) {
          fprintf(_stderr,"] %s %s:%d","InternalWriteFile",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                  ,0x84c);
          fprintf(_stderr,"Failed to get the current file position\n");
          PVar1 = 0x54f;
          goto LAB_00123bc0;
        }
        PVar1 = (**(code **)*pFileObject->_vptr_IPalObject)
                          (pFileObject->_vptr_IPalObject,pThread,1,pLocalDataLock._0_4_,
                           pLocalDataLock._4_4_,nNumberOfBytesToWrite,0,&local_58);
        if (PVar1 != 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00123d76;
          goto LAB_00123bc0;
        }
      }
      (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pThread,0);
      pLocalData = (CFileProcessLocalData *)0x0;
      pFileObject = (IPalObject *)0x0;
      sVar2 = write(iUnixFd,lpBuffer,(ulong)nNumberOfBytesToWrite);
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00123d76;
      if ((int)(DWORD)sVar2 < 0) {
        PVar1 = FILEGetLastErrorFromErrno();
      }
      else {
        *lpNumberOfBytesWritten = (DWORD)sVar2;
        PVar1 = 0;
      }
      goto LAB_00123bc0;
    }
    fprintf(_stderr,"] %s %s:%d","InternalWriteFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x813);
    __format = "lpOverlapped is not NULL, as it should be.\n";
  }
  fprintf(_stderr,__format);
  PVar1 = 0x57;
LAB_00123bc0:
  if (local_58 != (undefined8 *)0x0) {
    (**(code **)*local_58)();
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pThread,0);
  }
  if (pTransactionLock != (IFileTransactionLock *)0x0) {
    (*pTransactionLock->_vptr_IFileTransactionLock[8])(pTransactionLock,pThread);
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CorUnix::InternalWriteFile(
    CPalThread *pThread,
    HANDLE hFile,
    LPCVOID lpBuffer,
    DWORD nNumberOfBytesToWrite,
    LPDWORD lpNumberOfBytesWritten,
    LPOVERLAPPED lpOverlapped
    )
{
    PAL_ERROR palError = 0;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    IFileTransactionLock *pTransactionLock = NULL;
    int ifd;

    LONG writeOffsetStartLow = 0, writeOffsetStartHigh = 0;
    int res;

    if (NULL != lpNumberOfBytesWritten)
    {
        //
        // This must be set to 0 before any other error checking takes
        // place, per MSDN
        //

        *lpNumberOfBytesWritten = 0;
    }
    else
    {
        ASSERT( "lpNumberOfBytesWritten is NULL\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    // Win32 WriteFile disallows writing to STD_INPUT_HANDLE
    if (hFile == INVALID_HANDLE_VALUE || hFile == pStdIn)
    {
        palError = ERROR_INVALID_HANDLE;
        goto done;
    }
    else if ( lpOverlapped )
    {
        ASSERT( "lpOverlapped is not NULL, as it should be.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_WRITE,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }
    
    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    if (pLocalData->open_flags_deviceaccessonly == TRUE)
    {
        ERROR("File open for device access only\n");
        palError = ERROR_ACCESS_DENIED;
        goto done;
    }

    ifd = pLocalData->unix_fd;

    //
    // Inform the lock controller for this file (if any) of our intention
    // to perform a write. (Note that pipes don't have lock controllers.)
    //
    
    if (NULL != pLocalData->pLockController)
    {
        /* Get the current file position to calculate the region to lock */
        palError = InternalSetFilePointerForUnixFd(
            ifd,
            0,
            &writeOffsetStartHigh,
            FILE_CURRENT,
            &writeOffsetStartLow
            );

        if (NO_ERROR != palError)
        {
            ASSERT("Failed to get the current file position\n");
            palError = ERROR_INTERNAL_ERROR;
            goto done;
        }

        palError = pLocalData->pLockController->GetTransactionLock(
            pThread,
            IFileLockController::WriteLock,
            writeOffsetStartLow,
            writeOffsetStartHigh,
            nNumberOfBytesToWrite,
            0,
            &pTransactionLock
            );

        if (NO_ERROR != palError)
        {
            ERROR("Unable to obtain write transaction lock");
            goto done;
        }
    }

    //
    // Release the data lock before performing the (possibly blocking)
    // write call
    //

    pLocalDataLock->ReleaseLock(pThread, FALSE);
    pLocalDataLock = NULL;
    pLocalData = NULL;

#if WRITE_0_BYTES_HANGS_TTY
    if( nNumberOfBytesToWrite == 0 && isatty(ifd) )
    {
        res = 0;
        *lpNumberOfBytesWritten = 0;
        goto done;
    }
#endif

    res = write( ifd, lpBuffer, nNumberOfBytesToWrite );  
    TRACE("write() returns %d\n", res);

    if ( res >= 0 )
    {
        *lpNumberOfBytesWritten = res;
    }
    else
    {
        palError = FILEGetLastErrorFromErrno();
    }
    
done:
    
    if (NULL != pTransactionLock)
    {
        pTransactionLock->ReleaseLock();
    }

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}